

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O0

bool duckdb::StandardNumericToDecimalCast<long,long,duckdb::SignedToDecimalOperator>
               (long input,long *result,CastParameters *parameters,uint8_t width,uint8_t scale)

{
  bool bVar1;
  long lVar2;
  byte in_CL;
  long *in_RSI;
  long in_RDI;
  byte in_R8B;
  string error;
  long max_width;
  undefined6 in_stack_ffffffffffffff68;
  uchar in_stack_ffffffffffffff6e;
  uchar in_stack_ffffffffffffff6f;
  string *error_message;
  string *in_stack_ffffffffffffff78;
  undefined1 local_71 [33];
  string local_50 [32];
  long local_30;
  byte local_22;
  long *local_18;
  long local_10;
  byte local_1;
  
  local_22 = in_R8B;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_30 = UnsafeNumericCast<long,long,void>
                       (*(long *)(NumericHelper::POWERS_OF_TEN +
                                 (long)(int)((uint)in_CL - (uint)in_R8B) * 8));
  bVar1 = SignedToDecimalOperator::Operation<long,long>(local_10,local_30);
  if (bVar1) {
    error_message = (string *)local_71;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)(local_71 + 1),"Could not cast value %d to DECIMAL(%d,%d)",
               (allocator *)error_message);
    StringUtil::Format<long,unsigned_char,unsigned_char>
              (in_stack_ffffffffffffff78,(long)error_message,in_stack_ffffffffffffff6f,
               in_stack_ffffffffffffff6e);
    ::std::__cxx11::string::~string((string *)(local_71 + 1));
    ::std::allocator<char>::~allocator((allocator<char> *)local_71);
    HandleCastError::AssignError
              (error_message,
               (CastParameters *)
               CONCAT17(in_stack_ffffffffffffff6f,
                        CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)));
    local_1 = 0;
    ::std::__cxx11::string::~string(local_50);
  }
  else {
    lVar2 = UnsafeNumericCast<long,long,void>
                      (local_10 * *(long *)(NumericHelper::POWERS_OF_TEN + (ulong)local_22 * 8));
    *local_18 = lVar2;
    local_1 = 1;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool StandardNumericToDecimalCast(SRC input, DST &result, CastParameters &parameters, uint8_t width, uint8_t scale) {
	// check for overflow
	DST max_width = UnsafeNumericCast<DST>(NumericHelper::POWERS_OF_TEN[width - scale]);
	if (OP::template Operation<SRC, DST>(input, max_width)) {
		string error = StringUtil::Format("Could not cast value %d to DECIMAL(%d,%d)", input, width, scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = UnsafeNumericCast<DST>(DST(input) * NumericHelper::POWERS_OF_TEN[scale]);
	return true;
}